

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  anon_union_7040_2_2186ba77_for_ZopfliCostModel_6 *histogram;
  uint32_t *histogram_00;
  BackwardMatch *src2;
  uint32_t *puVar1;
  int *piVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  size_t gap;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar6;
  size_t sVar7;
  PreparedDictionary *pPVar8;
  float *pfVar9;
  byte bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  ZopfliCostModel *self;
  ulong uVar17;
  void *pvVar18;
  long lVar19;
  size_t sVar20;
  ulong *puVar21;
  ulong uVar22;
  BackwardMatch *pBVar23;
  undefined8 *puVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  size_t sVar29;
  size_t sVar30;
  float *cost;
  ZopfliCostModelArena *arena;
  ulong uVar31;
  uint8_t *puVar32;
  uint uVar33;
  ulong *puVar34;
  ulong *puVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  BackwardMatch *pBVar42;
  ulong uVar43;
  ulong uVar44;
  uint *puVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  long lVar49;
  size_t sVar50;
  size_t sVar51;
  size_t sVar52;
  bool bVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  ZopfliNode *local_280;
  ulong local_278;
  uint local_260;
  ulong local_250;
  long local_240;
  ulong local_238;
  void *local_228;
  long local_218;
  void *local_1f0;
  long local_1e8;
  ulong local_1e0;
  ulong local_1d0;
  ulong local_1c8;
  int orig_dist_cache [4];
  StartPosQueue local_138;
  
  sVar5 = params->stream_offset;
  iVar16 = params->lgwin;
  local_1c8 = position;
  if (num_bytes == 0) {
    local_1d0 = 0;
    local_1f0 = (void *)0x0;
  }
  else {
    local_1d0 = num_bytes * 4;
    local_1f0 = BrotliAllocate(m,local_1d0);
    if (0x7f < num_bytes) {
      local_1c8 = (position + num_bytes) - 0x7f;
    }
  }
  self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
  if (local_1d0 == 0) {
    local_228 = (void *)0x0;
  }
  else {
    local_228 = BrotliAllocate(m,num_bytes << 5);
  }
  uVar26 = (1L << ((byte)iVar16 & 0x3f)) - 0x10;
  gap = (params->dictionary).compound.total_size;
  uVar38 = (ulong)((params->dictionary).compound.num_chunks != 0) * 0x100;
  lVar19 = 0;
  local_1e8 = 0;
  do {
    if (num_bytes <= lVar19 + 3U) {
      sVar5 = *num_literals;
      sVar7 = *last_insert_len;
      uVar11 = *(undefined8 *)dist_cache;
      uVar12 = *(undefined8 *)(dist_cache + 2);
      sVar29 = *num_commands;
      sVar51 = num_bytes + 1;
      if (sVar51 == 0) {
        local_280 = (ZopfliNode *)0x0;
      }
      else {
        local_280 = (ZopfliNode *)BrotliAllocate(m,sVar51 * 0x10);
      }
      InitZopfliCostModel(m,self,&params->dist,num_bytes);
      histogram = &self->field_6;
      puVar6 = (self->field_6).arena.histogram_cmd;
      histogram_00 = (self->field_6).arena.histogram_dist;
      cost = (self->field_6).arena.cost_literal;
      for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
        BrotliInitZopfliNodes(local_280,sVar51);
        if (lVar19 == 0) {
          ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
        }
        else {
          sVar30 = *num_commands;
          switchD_016d8eb1::default(histogram,0,0x1780);
          uVar26 = position - sVar7;
          for (lVar27 = 0; lVar27 != sVar30 - sVar29; lVar27 = lVar27 + 1) {
            uVar47 = commands[lVar27].insert_len_;
            uVar33 = commands[lVar27].copy_len_;
            uVar3 = commands[lVar27].dist_prefix_;
            uVar4 = commands[lVar27].cmd_prefix_;
            puVar1 = puVar6 + uVar4;
            *puVar1 = *puVar1 + 1;
            if (0x7f < uVar4) {
              puVar1 = histogram_00 + (uVar3 & 0x3ff);
              *puVar1 = *puVar1 + 1;
            }
            uVar38 = (ulong)uVar47;
            uVar41 = uVar26;
            while (bVar53 = uVar38 != 0, uVar38 = uVar38 - 1, bVar53) {
              piVar2 = (int *)((long)histogram + (ulong)ringbuffer[uVar41 & ringbuffer_mask] * 4);
              *piVar2 = *piVar2 + 1;
              uVar41 = uVar41 + 1;
            }
            uVar26 = uVar26 + uVar47 + (ulong)(uVar33 & 0x1ffffff);
          }
          SetCost((uint32_t *)histogram->literal_histograms,0x100,1,cost);
          SetCost(puVar6,0x2c0,0,(float *)self);
          SetCost(histogram_00,(ulong)self->distance_histogram_size,0,self->cost_dist_);
          fVar54 = 1.7e+38;
          for (lVar27 = 0; lVar27 != 0x2c0; lVar27 = lVar27 + 1) {
            if (self->cost_cmd_[lVar27] <= fVar54) {
              fVar54 = self->cost_cmd_[lVar27];
            }
          }
          self->min_cost_cmd_ = fVar54;
          pfVar9 = self->literal_costs_;
          sVar30 = self->num_bytes_;
          *pfVar9 = 0.0;
          fVar55 = 0.0;
          fVar54 = 0.0;
          for (sVar50 = 0; sVar30 != sVar50; sVar50 = sVar50 + 1) {
            fVar55 = fVar55 + cost[ringbuffer[position + sVar50 & ringbuffer_mask]];
            fVar56 = fVar54 + fVar55;
            pfVar9[sVar50 + 1] = fVar56;
            fVar55 = fVar55 - (fVar56 - fVar54);
            fVar54 = fVar56;
          }
        }
        *num_commands = sVar29;
        *num_literals = sVar5;
        *last_insert_len = sVar7;
        *(undefined8 *)dist_cache = uVar11;
        *(undefined8 *)(dist_cache + 2) = uVar12;
        sVar30 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
        uVar47 = 0x145;
        if (params->quality < 0xb) {
          uVar47 = 0x96;
        }
        sVar50 = params->stream_offset;
        local_280->length = 0;
        (local_280->u).cost = 0.0;
        local_138.idx_ = 0;
        lVar27 = 0;
        for (sVar52 = 0; sVar52 + 3 < num_bytes; sVar52 = sVar52 + 1) {
          sVar20 = UpdateNodes(num_bytes,position,sVar52,ringbuffer,ringbuffer_mask,params,sVar30,
                               dist_cache,(ulong)*(uint *)((long)local_1f0 + sVar52 * 4),
                               (BackwardMatch *)((long)local_228 + lVar27 * 8),self,&local_138,
                               local_280);
          uVar26 = 0;
          if (0x3fff < sVar20) {
            uVar26 = sVar20;
          }
          uVar38 = (ulong)*(uint *)((long)local_1f0 + sVar52 * 4);
          lVar27 = lVar27 + uVar38;
          if (((uVar38 == 1) &&
              (uVar33 = *(uint *)((long)local_228 + lVar27 * 8 + -4) >> 5, uVar47 < uVar33)) &&
             (uVar26 < uVar33)) {
            uVar26 = (ulong)uVar33;
          }
          if (1 < uVar26) {
            while ((uVar26 = uVar26 - 1, uVar26 != 0 &&
                   (uVar38 = sVar52 + 4, sVar52 = sVar52 + 1, uVar38 < num_bytes))) {
              EvaluateNode(sVar50 + position,sVar52,sVar30,gap,dist_cache,self,&local_138,local_280)
              ;
              lVar27 = lVar27 + (ulong)*(uint *)((long)local_1f0 + sVar52 * 4);
            }
          }
        }
        sVar30 = ComputeShortestPathFromNodes(num_bytes,local_280);
        *num_commands = *num_commands + sVar30;
        BrotliZopfliCreateCommands
                  (num_bytes,position,local_280,dist_cache,last_insert_len,params,commands,
                   num_literals);
      }
      CleanupZopfliCostModel(m,self);
      BrotliFree(m,self);
      BrotliFree(m,local_280);
      BrotliFree(m,local_228);
      BrotliFree(m,local_1f0);
      return;
    }
    uVar41 = lVar19 + position;
    uVar31 = uVar26;
    if (uVar41 < uVar26) {
      uVar31 = uVar41;
    }
    uVar25 = uVar41 + sVar5;
    if (uVar26 <= uVar25) {
      uVar25 = uVar26;
    }
    if ((params->dictionary).contextual.context_based == 0) {
      uVar22 = 0;
    }
    else {
      if (uVar41 == 0) {
        bVar13 = 0;
LAB_01f6a6f4:
        uVar22 = 0;
      }
      else {
        bVar13 = ringbuffer[uVar41 - 1 & ringbuffer_mask];
        if (uVar41 == 1) goto LAB_01f6a6f4;
        uVar22 = (ulong)ringbuffer[uVar41 - 2 & ringbuffer_mask];
      }
      uVar22 = (ulong)(params->dictionary).contextual.context_map
                      [literal_context_lut[uVar22 + 0x100] | literal_context_lut[bVar13]];
    }
    uVar17 = (uVar38 | 0x80) + local_1e8;
    if (local_1d0 < uVar17) {
      uVar37 = local_1d0;
      if (local_1d0 == 0) {
        uVar37 = uVar17;
      }
      do {
        uVar43 = uVar37;
        uVar37 = uVar43 * 2;
      } while (uVar43 < uVar17);
      pvVar18 = BrotliAllocate(m,uVar43 * 8);
      if (local_1d0 != 0) {
        switchD_016b45db::default(pvVar18,local_228,local_1d0 << 3);
      }
      BrotliFree(m,local_228);
      local_228 = pvVar18;
      local_1d0 = uVar43;
    }
    uVar17 = num_bytes - lVar19;
    dictionary = (params->dictionary).contextual.dict[uVar22];
    lVar27 = local_1e8 + uVar38;
    src2 = (BackwardMatch *)((long)local_228 + lVar27 * 8);
    uVar22 = 0x10;
    if (params->quality == 0xb) {
      uVar22 = 0x40;
    }
    uVar37 = 0;
    if (uVar22 <= uVar41) {
      uVar37 = uVar41 - uVar22;
    }
    puVar21 = (ulong *)(ringbuffer + (uVar41 & ringbuffer_mask));
    uVar22 = uVar41;
    pBVar23 = src2;
    uVar43 = 1;
    while (((uVar22 = uVar22 - 1, uVar37 < uVar22 && (uVar43 < 3)) && (uVar41 - uVar22 <= uVar31)))
    {
      if (((uint8_t)*puVar21 == ringbuffer[uVar22 & ringbuffer_mask]) &&
         (puVar34 = (ulong *)(ringbuffer + (uVar22 & ringbuffer_mask)),
         *(char *)((long)puVar21 + 1) == *(char *)((long)puVar34 + 1))) {
        lVar36 = 0;
        uVar39 = uVar17;
        puVar35 = puVar21;
LAB_01f6a8b0:
        if (uVar39 < 8) {
          for (uVar46 = 0;
              (uVar39 != uVar46 &&
              (*(char *)((long)puVar34 + uVar46) == *(char *)((long)puVar35 + uVar46)));
              uVar46 = uVar46 + 1) {
          }
        }
        else {
          if (*puVar35 == *puVar34) goto code_r0x01f6a8c1;
          uVar46 = *puVar34 ^ *puVar35;
          uVar39 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar46 = uVar39 >> 3 & 0x1fffffff;
        }
        uVar46 = uVar46 - lVar36;
        if (uVar43 < uVar46) {
          pBVar23->distance = (uint32_t)(uVar41 - uVar22);
          pBVar23->length_and_code = (int)uVar46 << 5;
          pBVar23 = pBVar23 + 1;
          uVar43 = uVar46;
        }
      }
    }
    uVar47 = (uint)ringbuffer_mask;
    if (uVar43 < uVar17) {
      uVar15 = (uint)((int)*puVar21 * 0x1e35a7bd) >> 0xf;
      uVar22 = (hasher->privat)._H5.bucket_size_;
      puVar6 = (hasher->privat)._H2.buckets_;
      pvVar18 = (hasher->privat)._H40.extra[1];
      uVar33 = puVar6[uVar15];
      uVar37 = uVar17;
      if (0x7f < uVar17) {
        puVar6[uVar15] = (uint32_t)uVar41;
        uVar37 = 0x80;
      }
      uVar39 = uVar22 & uVar41;
      local_218 = uVar39 * 2 + 1;
      local_240 = uVar39 * 2;
      uVar39 = 0;
      local_238 = 0;
      lVar36 = 0x40;
      while (uVar46 = uVar41 - uVar33, uVar46 != 0) {
        bVar53 = lVar36 == 0;
        lVar36 = lVar36 + -1;
        if ((uVar31 < uVar46) || (bVar53)) break;
        uVar44 = local_238;
        if (uVar39 < local_238) {
          uVar44 = uVar39;
        }
        puVar35 = (ulong *)((long)puVar21 + uVar44);
        puVar34 = (ulong *)(ringbuffer + uVar44 + (uVar33 & uVar47));
        uVar48 = uVar17 - uVar44;
        lVar40 = 0;
LAB_01f6a9ff:
        if (uVar48 < 8) {
          for (uVar28 = 0;
              (uVar48 != uVar28 &&
              (*(char *)((long)puVar35 + uVar28) == *(char *)((long)puVar34 + uVar28)));
              uVar28 = uVar28 + 1) {
          }
        }
        else {
          if (*puVar34 == *puVar35) goto code_r0x01f6aa10;
          uVar28 = *puVar35 ^ *puVar34;
          uVar48 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
            }
          }
          uVar28 = uVar48 >> 3 & 0x1fffffff;
        }
        uVar44 = (uVar28 - lVar40) + uVar44;
        if (pBVar23 == (BackwardMatch *)0x0) {
          pBVar23 = (BackwardMatch *)0x0;
        }
        else if (uVar43 < uVar44) {
          pBVar23->distance = (uint32_t)uVar46;
          pBVar23->length_and_code = (int)uVar44 << 5;
          pBVar23 = pBVar23 + 1;
          uVar43 = uVar44;
        }
        uVar15 = (uint)uVar22;
        if (uVar37 <= uVar44) {
          if (uVar17 < 0x80) goto LAB_01f6ab6f;
          *(undefined4 *)((long)pvVar18 + local_240 * 4) =
               *(undefined4 *)((long)pvVar18 + (ulong)(uVar15 & uVar33) * 8);
          iVar16 = *(int *)((long)pvVar18 + (ulong)(uVar15 & uVar33) * 8 + 4);
          goto LAB_01f6ab5a;
        }
        if (ringbuffer[uVar44 + (uVar33 & uVar47)] < *(byte *)((long)puVar21 + uVar44)) {
          if (0x7f < uVar17) {
            *(uint *)((long)pvVar18 + local_240 * 4) = uVar33;
          }
          lVar40 = (ulong)(uVar33 & uVar15) * 2 + 1;
          uVar39 = uVar44;
          local_240 = lVar40;
        }
        else {
          if (0x7f < uVar17) {
            *(uint *)((long)pvVar18 + local_218 * 4) = uVar33;
          }
          lVar40 = (ulong)(uVar33 & uVar15) * 2;
          local_238 = uVar44;
          local_218 = lVar40;
        }
        uVar33 = *(uint *)((long)pvVar18 + lVar40 * 4);
      }
      if (0x7f < uVar17) {
        iVar16 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)pvVar18 + local_240 * 4) = iVar16;
LAB_01f6ab5a:
        *(int *)((long)pvVar18 + local_218 * 4) = iVar16;
      }
    }
LAB_01f6ab6f:
    for (lVar36 = 0; lVar36 != 0x26; lVar36 = lVar36 + 1) {
      local_138.q_[0].distance_cache[lVar36 + -2] = 0xfffffff;
    }
    uVar31 = uVar43 + 1;
    if (uVar43 + 1 < 5) {
      uVar31 = 4;
    }
    iVar16 = BrotliFindAllStaticDictionaryMatches
                       (dictionary,(uint8_t *)puVar21,uVar31,uVar17,(uint32_t *)&local_138);
    if (iVar16 != 0) {
      uVar22 = 0x25;
      if (uVar17 < 0x25) {
        uVar22 = uVar17;
      }
      iVar16 = (int)uVar31 << 5;
      for (; uVar31 <= uVar22; uVar31 = uVar31 + 1) {
        uVar33 = local_138.q_[0].distance_cache[uVar31 - 2];
        if ((uVar33 < 0xfffffff) &&
           (uVar37 = (ulong)(uVar33 >> 5) + gap + 1 + uVar25, uVar37 <= (params->dist).max_distance)
           ) {
          uVar33 = uVar33 & 0x1f;
          pBVar23->distance = (uint32_t)uVar37;
          if (uVar31 == uVar33) {
            uVar33 = 0;
          }
          pBVar23->length_and_code = uVar33 + iVar16;
          pBVar23 = pBVar23 + 1;
        }
        iVar16 = iVar16 + 0x20;
      }
    }
    sVar29 = (long)pBVar23 - (long)src2 >> 3;
    sVar7 = (params->dictionary).compound.num_chunks;
    if (sVar7 != 0) {
      uVar31 = (params->dist).max_distance;
      sVar51 = (params->dictionary).compound.total_size;
      pBVar23 = (BackwardMatch *)((long)local_228 + lVar27 * 8 + -0x200);
      local_1e0 = 3;
      sVar50 = 0;
      for (sVar30 = 0; sVar30 != sVar7; sVar30 = sVar30 + 1) {
        pPVar8 = (params->dictionary).compound.chunks[sVar30];
        bVar13 = (byte)pPVar8->bucket_bits;
        bVar14 = (byte)pPVar8->slot_bits;
        bVar10 = -(char)pPVar8->hash_bits;
        uVar22 = ((*puVar21 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (-bVar13 & 0x3f);
        lVar36 = (1L << (bVar14 & 0x3f)) * 4;
        lVar40 = (1L << (bVar13 & 0x3f)) * 2;
        bVar14 = -bVar14;
        uVar33 = (uint)*(ushort *)((long)&pPVar8[1].magic + (uVar22 & 0xffffffff) * 2 + lVar36);
        puVar24 = (undefined8 *)
                  ((long)&pPVar8[1].magic + (ulong)pPVar8->num_items * 4 + lVar40 + lVar36);
        if (pPVar8->magic != 0xdebcede0) {
          puVar24 = (undefined8 *)*puVar24;
        }
        sVar52 = (params->dictionary).compound.chunk_offsets[sVar30];
        pBVar42 = pBVar23 + sVar50;
        uVar15 = pPVar8->source_size;
        puVar45 = (uint *)((long)&pPVar8[1].magic +
                          (ulong)(uVar33 + (&pPVar8[1].magic)
                                           [(uint)((int)uVar22 << (bVar14 & 0x1f)) >>
                                            (bVar14 & 0x1f)]) * 4 + lVar40 + lVar36);
        uVar33 = (uint)(uVar33 == 0xffff);
        lVar36 = 0;
        uVar22 = local_1e0;
        do {
          uVar37 = (uVar41 & ringbuffer_mask) + uVar22;
          do {
            do {
              if (uVar33 != 0) goto LAB_01f6af40;
              uVar33 = *puVar45;
              puVar45 = puVar45 + 1;
              uVar39 = (ulong)(uVar33 & 0x7fffffff);
              uVar33 = uVar33 & 0x80000000;
              uVar46 = ((uVar25 + sVar51) - sVar52) - uVar39;
              uVar43 = uVar15 - uVar39;
              if (uVar17 <= uVar43) {
                uVar43 = uVar17;
              }
            } while ((((uVar31 < uVar46) || (ringbuffer_mask < uVar37)) || (uVar43 <= uVar22)) ||
                    (ringbuffer[uVar37] != *(uint8_t *)((long)puVar24 + uVar22 + uVar39)));
            lVar40 = (long)puVar24 + uVar39;
            uVar48 = 0;
            lVar49 = 0;
            puVar34 = puVar21;
            uVar44 = uVar43;
LAB_01f6ae75:
            if (7 < uVar44) {
              if (*puVar34 == *(ulong *)(lVar40 + uVar48)) goto code_r0x01f6ae87;
              uVar39 = *(ulong *)(lVar40 + uVar48) ^ *puVar34;
              uVar43 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar49;
              goto LAB_01f6aef5;
            }
            lVar49 = uVar39 + uVar43 + (long)puVar24;
            for (; uVar43 != uVar48; uVar48 = uVar48 + 1) {
              if (*(char *)(lVar40 + uVar48) != *(char *)((long)puVar21 + uVar48)) {
                lVar49 = uVar48 + lVar40;
                break;
              }
            }
            uVar43 = lVar49 - lVar40;
LAB_01f6aef5:
          } while (uVar43 <= uVar22);
          pBVar42->distance = (uint32_t)uVar46;
          pBVar42->length_and_code = (int)uVar43 << 5;
          pBVar42 = pBVar42 + 1;
          lVar36 = lVar36 + 1;
          uVar22 = uVar43;
        } while (lVar36 != 0x40 - sVar50);
LAB_01f6af40:
        sVar50 = sVar50 + lVar36;
        if (sVar50 != 0) {
          if (sVar50 == 0x40) break;
          local_1e0 = (ulong)(*(uint *)((long)local_228 + sVar50 * 8 + lVar27 * 8 + -0x204) >> 5);
        }
      }
      MergeMatches((BackwardMatch *)((long)local_228 + local_1e8 * 8),pBVar23,sVar50,src2,sVar29);
      sVar29 = sVar29 + sVar50;
    }
    *(int *)((long)local_1f0 + lVar19 * 4) = (int)sVar29;
    lVar27 = local_1e8;
    if (sVar29 != 0) {
      lVar27 = sVar29 + local_1e8;
      uVar33 = *(uint *)((long)local_228 + lVar27 * 8 + -4);
      if (0x28bf < uVar33) {
        uVar22 = (ulong)(uVar33 >> 5);
        *(undefined8 *)((long)local_228 + local_1e8 * 8) =
             *(undefined8 *)((long)local_228 + lVar27 * 8 + -8);
        uVar31 = uVar41 + 1;
        uVar25 = uVar41 + uVar22;
        lVar27 = uVar22 - 1;
        if (local_1c8 <= uVar25) {
          uVar25 = local_1c8;
        }
        uVar22 = uVar25 - 0x3f;
        if (uVar25 < uVar41 + 0x40) {
          uVar22 = uVar31;
        }
        *(undefined4 *)((long)local_1f0 + lVar19 * 4) = 1;
        if (uVar41 + 0x201 <= uVar22) {
          for (; uVar31 < uVar22; uVar31 = uVar31 + 8) {
            uVar41 = (hasher->privat)._H5.bucket_size_;
            puVar6 = (hasher->privat)._H2.buckets_;
            uVar43 = uVar31 & ringbuffer_mask;
            pvVar18 = (hasher->privat)._H40.extra[1];
            uVar15 = (uint)(*(int *)(ringbuffer + uVar43) * 0x1e35a7bd) >> 0xf;
            uVar33 = puVar6[uVar15];
            local_250 = (uVar41 & uVar31) * 2 + 1;
            local_278 = (uVar41 & uVar31) * 2;
            puVar6[uVar15] = (uint32_t)uVar31;
            uVar37 = 0;
            uVar17 = 0;
            lVar36 = 0x40;
            while (uVar31 != uVar33) {
              bVar53 = lVar36 == 0;
              lVar36 = lVar36 + -1;
              if ((uVar41 - 0xf < uVar31 - uVar33) || (bVar53)) break;
              uVar39 = uVar17;
              if (uVar37 < uVar17) {
                uVar39 = uVar37;
              }
              puVar21 = (ulong *)(ringbuffer + uVar39 + (uVar33 & uVar47));
              uVar46 = 0x80 - uVar39;
              lVar40 = 0;
              puVar34 = (ulong *)(ringbuffer + uVar39 + uVar43);
LAB_01f6b157:
              if (7 < uVar46) {
                if (*puVar21 == *puVar34) goto code_r0x01f6b169;
                uVar44 = *puVar34 ^ *puVar21;
                uVar46 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                lVar40 = (uVar46 >> 3 & 0x1fffffff) - lVar40;
                goto LAB_01f6b1af;
              }
              for (uVar44 = 0; puVar32 = ringbuffer + uVar43 + 0x80, uVar46 != uVar44;
                  uVar44 = uVar44 + 1) {
                if (*(char *)((long)puVar34 + uVar44) != *(char *)((long)puVar21 + uVar44)) {
                  puVar32 = (uint8_t *)((long)puVar34 + uVar44);
                  break;
                }
              }
              lVar40 = (long)puVar32 - (long)(ringbuffer + uVar39 + uVar43);
LAB_01f6b1af:
              uVar39 = lVar40 + uVar39;
              local_260 = (uint)uVar41;
              if (0x7f < uVar39) {
                *(undefined4 *)((long)pvVar18 + local_278 * 4) =
                     *(undefined4 *)((long)pvVar18 + (ulong)(local_260 & uVar33) * 8);
                iVar16 = *(int *)((long)pvVar18 + (ulong)(local_260 & uVar33) * 8 + 4);
                goto LAB_01f6b245;
              }
              uVar46 = (ulong)(uVar33 & local_260) * 2;
              if (ringbuffer[uVar39 + (uVar33 & uVar47)] < ringbuffer[uVar39 + uVar43]) {
                *(uint *)((long)pvVar18 + local_278 * 4) = uVar33;
                uVar46 = uVar46 | 1;
                uVar37 = uVar39;
                local_278 = uVar46;
              }
              else {
                *(uint *)((long)pvVar18 + local_250 * 4) = uVar33;
                uVar17 = uVar39;
                local_250 = uVar46;
              }
              uVar33 = *(uint *)((long)pvVar18 + uVar46 * 4);
            }
            iVar16 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)pvVar18 + local_278 * 4) = iVar16;
LAB_01f6b245:
            *(int *)((long)pvVar18 + local_250 * 4) = iVar16;
          }
        }
        for (; uVar22 < uVar25; uVar22 = uVar22 + 1) {
          uVar41 = (hasher->privat)._H5.bucket_size_;
          puVar6 = (hasher->privat)._H2.buckets_;
          uVar37 = uVar22 & ringbuffer_mask;
          pvVar18 = (hasher->privat)._H40.extra[1];
          uVar15 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0xf;
          uVar33 = puVar6[uVar15];
          local_250 = (uVar41 & uVar22) * 2 + 1;
          local_278 = (uVar41 & uVar22) * 2;
          puVar6[uVar15] = (uint32_t)uVar22;
          uVar17 = 0;
          uVar31 = 0;
          lVar36 = 0x40;
          while (uVar22 != uVar33) {
            bVar53 = lVar36 == 0;
            lVar36 = lVar36 + -1;
            if ((uVar41 - 0xf < uVar22 - uVar33) || (bVar53)) break;
            uVar43 = uVar31;
            if (uVar17 < uVar31) {
              uVar43 = uVar17;
            }
            puVar21 = (ulong *)(ringbuffer + uVar43 + (uVar33 & uVar47));
            uVar39 = 0x80 - uVar43;
            lVar40 = 0;
            puVar34 = (ulong *)(ringbuffer + uVar43 + uVar37);
LAB_01f6b335:
            if (7 < uVar39) {
              if (*puVar21 == *puVar34) goto code_r0x01f6b347;
              uVar46 = *puVar34 ^ *puVar21;
              uVar39 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              lVar40 = (uVar39 >> 3 & 0x1fffffff) - lVar40;
              goto LAB_01f6b38c;
            }
            for (uVar46 = 0; puVar32 = ringbuffer + uVar37 + 0x80, uVar39 != uVar46;
                uVar46 = uVar46 + 1) {
              if (*(char *)((long)puVar34 + uVar46) != *(char *)((long)puVar21 + uVar46)) {
                puVar32 = (uint8_t *)((long)puVar34 + uVar46);
                break;
              }
            }
            lVar40 = (long)puVar32 - (long)(ringbuffer + uVar43 + uVar37);
LAB_01f6b38c:
            uVar43 = lVar40 + uVar43;
            local_260 = (uint)uVar41;
            if (0x7f < uVar43) {
              *(undefined4 *)((long)pvVar18 + local_278 * 4) =
                   *(undefined4 *)((long)pvVar18 + (ulong)(local_260 & uVar33) * 8);
              iVar16 = *(int *)((long)pvVar18 + (ulong)(local_260 & uVar33) * 8 + 4);
              goto LAB_01f6b41f;
            }
            uVar39 = (ulong)(uVar33 & local_260) * 2;
            if (ringbuffer[uVar43 + (uVar33 & uVar47)] < ringbuffer[uVar43 + uVar37]) {
              *(uint *)((long)pvVar18 + local_278 * 4) = uVar33;
              uVar39 = uVar39 | 1;
              uVar17 = uVar43;
              local_278 = uVar39;
            }
            else {
              *(uint *)((long)pvVar18 + local_250 * 4) = uVar33;
              uVar31 = uVar43;
              local_250 = uVar39;
            }
            uVar33 = *(uint *)((long)pvVar18 + uVar39 * 4);
          }
          iVar16 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)pvVar18 + local_278 * 4) = iVar16;
LAB_01f6b41f:
          *(int *)((long)pvVar18 + local_250 * 4) = iVar16;
        }
        switchD_016d8eb1::default((void *)((long)local_1f0 + lVar19 * 4 + 4),0,lVar27 * 4);
        lVar19 = lVar19 + lVar27;
        lVar27 = local_1e8 + 1;
      }
    }
    local_1e8 = lVar27;
    lVar19 = lVar19 + 1;
  } while( true );
code_r0x01f6a8c1:
  puVar35 = puVar35 + 1;
  puVar34 = puVar34 + 1;
  uVar39 = uVar39 - 8;
  lVar36 = lVar36 + -8;
  goto LAB_01f6a8b0;
code_r0x01f6aa10:
  puVar34 = puVar34 + 1;
  puVar35 = puVar35 + 1;
  uVar48 = uVar48 - 8;
  lVar40 = lVar40 + -8;
  goto LAB_01f6a9ff;
code_r0x01f6ae87:
  puVar34 = puVar34 + 1;
  uVar44 = uVar44 - 8;
  lVar49 = lVar49 + -8;
  uVar48 = uVar48 + 8;
  goto LAB_01f6ae75;
code_r0x01f6b169:
  puVar21 = puVar21 + 1;
  puVar34 = puVar34 + 1;
  uVar46 = uVar46 - 8;
  lVar40 = lVar40 + -8;
  goto LAB_01f6b157;
code_r0x01f6b347:
  puVar21 = puVar21 + 1;
  puVar34 = puVar34 + 1;
  uVar39 = uVar39 - 8;
  lVar40 = lVar40 + -8;
  goto LAB_01f6b335;
}

Assistant:

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t shadow_matches =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) ||
      BROTLI_IS_NULL(num_matches) || BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, max_length,
          dictionary_start, params->dist.max_distance,
          &matches[cur_match_pos + shadow_matches - 64], 64);
      MergeMatches(&matches[cur_match_pos],
          &matches[cur_match_pos + shadow_matches - 64], cd_matches,
          &matches[cur_match_pos + shadow_matches], num_found_matches);
      num_found_matches += cd_matches;
    }
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}